

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# computer.cpp
# Opt level: O2

float indk::Computer::doCompareCPFunctionD
                (vector<indk::Position_*,_std::allocator<indk::Position_*>_> *CP,
                vector<indk::Position_*,_std::allocator<indk::Position_*>_> *CPf)

{
  ulong uVar1;
  ulong uVar2;
  float fVar3;
  float fVar4;
  
  uVar1 = (long)(CP->super__Vector_base<indk::Position_*,_std::allocator<indk::Position_*>_>).
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(CP->super__Vector_base<indk::Position_*,_std::allocator<indk::Position_*>_>).
                _M_impl.super__Vector_impl_data._M_start >> 3;
  uVar2 = (long)(CPf->super__Vector_base<indk::Position_*,_std::allocator<indk::Position_*>_>).
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(CPf->super__Vector_base<indk::Position_*,_std::allocator<indk::Position_*>_>).
                _M_impl.super__Vector_impl_data._M_start >> 3;
  if (uVar1 <= uVar2) {
    uVar2 = uVar1;
  }
  uVar1 = 0;
  if ((long)uVar2 < 1) {
    uVar2 = uVar1;
  }
  fVar3 = 0.0;
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    fVar4 = Position::getDistance
                      ((CP->super__Vector_base<indk::Position_*,_std::allocator<indk::Position_*>_>)
                       ._M_impl.super__Vector_impl_data._M_start[uVar1],
                       (CPf->super__Vector_base<indk::Position_*,_std::allocator<indk::Position_*>_>
                       )._M_impl.super__Vector_impl_data._M_start[uVar1]);
    fVar3 = fVar3 + fVar4;
  }
  return fVar3;
}

Assistant:

float indk::Computer::doCompareCPFunctionD(std::vector<indk::Position*> CP, std::vector<indk::Position*> CPf) {
    float R = 0;
    int64_t L = CP.size();
    if (CPf.size() < L) L = CPf.size();
    for (int i = 0; i < L; i++) R += indk::Position::getDistance(CP[i], CPf[i]);
    return R;
}